

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small.c
# Opt level: O0

void small_mempool_update_group(small_mempool *small_mempool)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  small_mempool *psStack_18;
  int used_idx;
  small_mempool *pool;
  small_mempool *small_mempool_local;
  
  psStack_18 = small_mempool->group->first;
  while( true ) {
    if (small_mempool->group->last < psStack_18) {
      return;
    }
    iVar2 = 0;
    uVar3 = small_mempool->group->active_pool_mask & psStack_18->appropriate_pool_mask;
    for (uVar1 = uVar3; (uVar1 & 1) == 0; uVar1 = uVar1 >> 1 | 0x80000000) {
      iVar2 = iVar2 + 1;
    }
    iVar2 = iVar2 + 1;
    if (uVar3 == 0) {
      iVar2 = 0;
    }
    if (iVar2 + -1 < 0) {
      __assert_fail("used_idx >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small.c"
                    ,0x38,"void small_mempool_update_group(struct small_mempool *)");
    }
    psStack_18->used_pool = small_mempool->group->first + (iVar2 + -1);
    if (psStack_18->used_pool < psStack_18) {
      __assert_fail("pool->used_pool >= pool",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small.c"
                    ,0x3a,"void small_mempool_update_group(struct small_mempool *)");
    }
    if ((psStack_18->used_pool->pool).objsize < (psStack_18->pool).objsize) break;
    psStack_18 = psStack_18 + 1;
  }
  __assert_fail("pool->pool.objsize <= pool->used_pool->pool.objsize",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small.c",
                0x3b,"void small_mempool_update_group(struct small_mempool *)");
}

Assistant:

static inline void
small_mempool_update_group(struct small_mempool *small_mempool)
{
	for (struct small_mempool *pool = small_mempool->group->first;
	     pool <= small_mempool->group->last; pool++) {
		/*
		 * Recalculate pools for allocation.
		 * We select the pool with the lowest index,
		 * thus reducing allocation waste.
		 */
		int used_idx =
			__builtin_ffs(small_mempool->group->active_pool_mask &
				      pool->appropriate_pool_mask) - 1;
		assert(used_idx >= 0);
		pool->used_pool = small_mempool->group->first + used_idx;
		assert(pool->used_pool >= pool);
		assert(pool->pool.objsize <= pool->used_pool->pool.objsize);
	}
}